

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "usage: processno totalprocesses\n-h help\n-n no shuffled events\n-r use Fisher-Yates shuffle\n-R use std::shuffle\n-v version\n-t text mode\n"
         );
  return;
}

Assistant:

void help() {
    fprintf(stderr, "usage: processno totalprocesses\n"
                    "-h help\n"
                    "-n no shuffled events\n"
		    "-r use Fisher-Yates shuffle\n"
		    "-R use std::shuffle\n"
                    "-v version\n"
                    "-t text mode\n");
}